

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

void If_Dec7MinimumBase(word *uTruth,int *pSupp,int nVarsAll,int *pnVars)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  word wVar12;
  int iVar13;
  word *pwVar14;
  word *pwVar15;
  
  if (7 < nVarsAll) {
    __assert_fail("nVarsAll <= 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                  ,0x223,"void If_Dec7MinimumBase(word *, int *, int, int *)");
  }
  if (nVarsAll < 1) {
    iVar13 = 0;
    uVar9 = 0;
  }
  else {
    uVar8 = *uTruth;
    uVar10 = 0;
    pwVar14 = Truth6;
    uVar9 = 0;
    iVar13 = 0;
    do {
      if (uVar10 == 6) {
        if (uVar8 != uTruth[1]) {
LAB_00391825:
          uVar11 = 1 << ((byte)uVar10 & 0x1f);
LAB_00391839:
          if (pSupp != (int *)0x0) {
            pSupp[iVar13] = pSupp[uVar10];
          }
          uVar9 = uVar9 | uVar11;
          iVar13 = iVar13 + 1;
        }
      }
      else {
        uVar1 = *pwVar14;
        uVar11 = 1 << ((byte)uVar10 & 0x1f);
        if ((uVar1 & uVar8) >> ((byte)uVar11 & 0x3f) != (uVar8 & ~uVar1)) goto LAB_00391839;
        if ((uVar1 & uTruth[1]) >> ((byte)uVar11 & 0x3f) != (~uVar1 & uTruth[1])) goto LAB_00391825;
      }
      uVar10 = uVar10 + 1;
      pwVar14 = pwVar14 + 1;
    } while ((uint)nVarsAll != uVar10);
  }
  if (pnVars != (int *)0x0) {
    *pnVars = iVar13;
  }
  if ((uVar9 + 1 & uVar9) != 0) {
    if (nVarsAll < 1) {
      iVar6 = 0;
    }
    else {
      uVar8 = 0;
      pwVar14 = Truth7[6] + 1;
      iVar6 = 0;
      do {
        if ((uVar9 >> ((uint)uVar8 & 0x1f) & 1) != 0) {
          if (iVar6 < (int)(uint)uVar8) {
            uVar10 = uVar8;
            pwVar15 = pwVar14;
            do {
              if (uVar10 == 6) {
                uVar11 = *(uint *)((long)uTruth + 4);
                *(int *)((long)uTruth + 4) = (int)uTruth[1];
                wVar12 = uTruth[1] & 0xffffffff00000000 | (ulong)uVar11;
              }
              else {
                if (5 < (long)uVar10) {
                  __assert_fail("v < 5",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                                ,0x10a,"void If_Dec7SwapAdjacent(word *, int)");
                }
                uVar1 = pwVar15[-2];
                uVar2 = (*(word (*) [2])(pwVar15 + -1))[0];
                uVar3 = *uTruth;
                bVar7 = (byte)(1 << ((char)uVar10 - 1U & 0x1f));
                uVar4 = *pwVar15;
                uVar5 = uTruth[1];
                *uTruth = (uVar3 & uVar4) >> (bVar7 & 0x3f) |
                          (uVar2 & uVar3) << (bVar7 & 0x3f) | uVar1 & uVar3;
                wVar12 = (uVar5 & uVar4) >> (bVar7 & 0x3f) |
                         (uVar2 & uVar5) << (bVar7 & 0x3f) | uVar1 & uVar5;
              }
              uVar10 = uVar10 - 1;
              uTruth[1] = wVar12;
              pwVar15 = pwVar15 + -3;
            } while ((long)iVar6 < (long)uVar10);
          }
          iVar6 = iVar6 + 1;
        }
        uVar8 = uVar8 + 1;
        pwVar14 = pwVar14 + 3;
      } while (uVar8 != (uint)nVarsAll);
    }
    if (iVar6 != iVar13) {
      __assert_fail("Var == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                    ,0x21e,"void If_Dec7TruthShrink(word *, int, int, unsigned int)");
    }
  }
  return;
}

Assistant:

void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 7 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_Dec7HasVar( uTruth, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_DecSuppIsMinBase( uSupp ) )
        return;
    If_Dec7TruthShrink( uTruth, iVar, nVarsAll, uSupp );
}